

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_NtkTerSimulate(Au_Ntk_t *p)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  char *pcVar6;
  uint local_24;
  uint local_20;
  int Counter [2];
  int i;
  Au_Obj_t *pTerm;
  Au_Ntk_t *p_local;
  
  memset(&local_24,0,8);
  if (p->pMan->pFuncs == (Abc_Nam_t *)0x0) {
    pcVar6 = Au_NtkName(p);
    printf("Collapsing model \"%s\"...\n",pcVar6);
    for (Counter[0] = 0; iVar4 = Counter[0], iVar3 = Vec_IntSize(&p->vPis), iVar4 < iVar3;
        Counter[0] = Counter[0] + 1) {
      register0x00000000 = Au_NtkPi(p,Counter[0]);
      Au_ObjSetXsim(register0x00000000,3);
    }
    p->pMan->nPortsC0 = 0.0;
    p->pMan->nPortsC1 = 0.0;
    p->pMan->nPortsNC = 0.0;
    Au_NtkTerSimulate_rec(p);
    for (Counter[0] = 0; iVar4 = Counter[0], iVar3 = Vec_IntSize(&p->vPos), uVar2 = local_20,
        uVar1 = local_24, iVar4 < iVar3; Counter[0] = Counter[0] + 1) {
      register0x00000000 = Au_NtkPo(p,Counter[0]);
      iVar4 = Au_ObjGetXsim(register0x00000000);
      if (iVar4 == 1) {
        local_24 = local_24 + 1;
      }
      else {
        iVar4 = Au_ObjGetXsim(stack0xffffffffffffffe8);
        if (iVar4 == 2) {
          local_20 = local_20 + 1;
        }
      }
    }
    uVar5 = Au_NtkPoNum(p);
    printf("Const0 outputs =%15d. Const1 outputs =%15d.  Total outputs =%15d.\n",(ulong)uVar1,
           (ulong)uVar2,(ulong)uVar5);
    printf("Const0 ports =  %.0f. Const1  ports =  %.0f. Non-const ports=  %.0f.  Total ports =  %.0f.\n"
           ,p->pMan->nPortsC0,p->pMan->nPortsC1,p->pMan->nPortsNC,
           p->pMan->nPortsC0 + p->pMan->nPortsC1 + p->pMan->nPortsNC);
    return;
  }
  __assert_fail("p->pMan->pFuncs == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcHieNew.c"
                ,0x57e,"void Au_NtkTerSimulate(Au_Ntk_t *)");
}

Assistant:

void Au_NtkTerSimulate( Au_Ntk_t * p )
{
    Au_Obj_t * pTerm;
    int i, Counter[2] = {0};
    assert( p->pMan->pFuncs == NULL );
    printf( "Collapsing model \"%s\"...\n", Au_NtkName(p) );
    // create PIs
    Au_NtkForEachPi( p, pTerm, i )
        Au_ObjSetXsim( pTerm, AU_VALX );
    // recursively flatten hierarchy
    p->pMan->nPortsC0 = 0;
    p->pMan->nPortsC1 = 0;
    p->pMan->nPortsNC = 0;
    Au_NtkTerSimulate_rec( p );
    // analyze outputs
    Au_NtkForEachPo( p, pTerm, i )
        if ( Au_ObjGetXsim(pTerm) == AU_VAL0 )
            Counter[0]++;
        else if ( Au_ObjGetXsim(pTerm) == AU_VAL1 )
            Counter[1]++;
    // print results
    printf( "Const0 outputs =%15d. Const1 outputs =%15d.  Total outputs =%15d.\n", 
        Counter[0], Counter[1], Au_NtkPoNum(p) );
    printf( "Const0 ports =  %.0f. Const1  ports =  %.0f. Non-const ports=  %.0f.  Total ports =  %.0f.\n", 
        p->pMan->nPortsC0, p->pMan->nPortsC1, p->pMan->nPortsNC, p->pMan->nPortsC0 + p->pMan->nPortsC1 + p->pMan->nPortsNC );
}